

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_proj.c
# Opt level: O0

void PDHG_Restart_Iterate(CUPDLPwork *pdhg)

{
  int iVar1;
  long in_RDI;
  CUPDLPwork *in_stack_00000050;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x40);
  if ((iVar1 != 0) && (iVar1 == 1)) {
    PDHG_Restart_Iterate_GPU(in_stack_00000050);
  }
  return;
}

Assistant:

void PDHG_Restart_Iterate(CUPDLPwork *pdhg) {
  switch (pdhg->settings->eRestartMethod) {
    case PDHG_WITHOUT_RESTART:
      break;
    case PDHG_GPU_RESTART:
      PDHG_Restart_Iterate_GPU(pdhg);
      break;
    case PDHG_CPU_RESTART:
      // TODO: implement PDHG_Restart_Iterate_CPU(pdhg);
      break;
  }
}